

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::DeepTiledInputFile::initialize(DeepTiledInputFile *this)

{
  int minX;
  int maxX;
  int minY;
  int maxY;
  uint uVar1;
  LevelMode LVar2;
  LevelRoundingMode LVar3;
  bool bVar4;
  Format FVar5;
  string *__lhs;
  int *piVar6;
  TileDescription *pTVar7;
  LineOrder *pLVar8;
  Box2i *pBVar9;
  TileBuffer *pTVar10;
  Compression *pCVar11;
  Compressor *pCVar12;
  ChannelList *this_00;
  const_iterator cVar13;
  ConstIterator CVar14;
  ostream *poVar15;
  ArgExc *pAVar16;
  Int64 size;
  Data *pDVar17;
  ulong uVar18;
  ConstIterator tmp;
  stringstream _iex_throw_s;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_1a0 [15];
  
  pDVar17 = this->_data;
  if (pDVar17->partNumber == -1) {
    __lhs = Header::type_abi_cxx11_(&pDVar17->header);
    bVar4 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)DEEPTILE_abi_cxx11_);
    if (bVar4) {
      pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar16,"Expected a deep tiled file but the file is not deep tiled.");
      __cxa_throw(pAVar16,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
    pDVar17 = this->_data;
  }
  piVar6 = Header::version(&pDVar17->header);
  if (*piVar6 == 1) {
    Header::sanityCheck(&this->_data->header,true,false);
    pTVar7 = Header::tileDescription(&this->_data->header);
    pDVar17 = this->_data;
    uVar1 = pTVar7->ySize;
    LVar2 = pTVar7->mode;
    LVar3 = pTVar7->roundingMode;
    (pDVar17->tileDesc).xSize = pTVar7->xSize;
    (pDVar17->tileDesc).ySize = uVar1;
    (pDVar17->tileDesc).mode = LVar2;
    (pDVar17->tileDesc).roundingMode = LVar3;
    pLVar8 = Header::lineOrder(&this->_data->header);
    pDVar17 = this->_data;
    pDVar17->lineOrder = *pLVar8;
    pBVar9 = Header::dataWindow(&pDVar17->header);
    minX = (pBVar9->min).x;
    pDVar17 = this->_data;
    pDVar17->minX = minX;
    maxX = (pBVar9->max).x;
    pDVar17->maxX = maxX;
    minY = (pBVar9->min).y;
    pDVar17->minY = minY;
    maxY = (pBVar9->max).y;
    pDVar17->maxY = maxY;
    precalculateTileInfo
              (&pDVar17->tileDesc,minX,maxX,minY,maxY,&pDVar17->numXTiles,&pDVar17->numYTiles,
               &pDVar17->numXLevels,&pDVar17->numYLevels);
    pDVar17 = this->_data;
    TileOffsets::TileOffsets
              ((TileOffsets *)&_iex_throw_s,(pDVar17->tileDesc).mode,pDVar17->numXLevels,
               pDVar17->numYLevels,pDVar17->numXTiles,pDVar17->numYTiles);
    TileOffsets::operator=(&this->_data->tileOffsets,(TileOffsets *)&_iex_throw_s);
    std::
    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::~vector(local_1a0);
    for (uVar18 = 0; pDVar17 = this->_data,
        uVar18 < (ulong)((long)(pDVar17->tileBuffers).
                               super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pDVar17->tileBuffers).
                               super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar18 = uVar18 + 1)
    {
      pTVar10 = (TileBuffer *)operator_new(0xa0);
      (pTVar10->exception)._M_dataplus._M_p = (pointer)0x0;
      pTVar10->uncompressedData = (char *)0x0;
      pTVar10->buffer = (char *)0x0;
      pTVar10->dataSize = 0;
      *(undefined4 *)&pTVar10->field_0x14 = 0;
      pTVar10->compressor = (Compressor *)0x0;
      pTVar10->format = NATIVE;
      pTVar10->dx = 0;
      pTVar10->dy = 0;
      pTVar10->lx = 0;
      FVar5 = defaultFormat((Compressor *)0x0);
      *(Format *)&(pTVar10->exception)._M_string_length = FVar5;
      *(undefined4 *)((long)&(pTVar10->exception)._M_string_length + 4) = 0xffffffff;
      *(undefined4 *)&(pTVar10->exception).field_2 = 0xffffffff;
      *(undefined4 *)((long)&(pTVar10->exception).field_2 + 4) = 0xffffffff;
      *(undefined4 *)((long)&(pTVar10->exception).field_2 + 8) = 0xffffffff;
      (pTVar10->exception).field_2._M_local_buf[0xc] = '\0';
      *(undefined1 **)&(pTVar10->_sem).field_0x0 = &pTVar10->field_0x60 + 8;
      *(undefined8 *)&pTVar10->field_0x60 = 0;
      (&pTVar10->field_0x60)[8] = 0;
      IlmThread_2_5::Semaphore::Semaphore((Semaphore *)(&pTVar10->field_0x70 + 8),1);
      (this->_data->tileBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar18] = pTVar10;
    }
    size = (ulong)((pDVar17->tileDesc).xSize * (pDVar17->tileDesc).ySize) << 2;
    pDVar17->maxSampleCountTableSize = size;
    Array<char>::resizeErase(&pDVar17->sampleCountTableBuffer,size);
    pCVar11 = Header::compression(&this->_data->header);
    pCVar12 = newCompressor(*pCVar11,this->_data->maxSampleCountTableSize,&this->_data->header);
    pDVar17 = this->_data;
    pDVar17->sampleCountTableComp = pCVar12;
    this_00 = Header::channels(&pDVar17->header);
    this->_data->combinedSampleSize = 0;
    cVar13._M_node = (_Base_ptr)ChannelList::begin(this_00);
    while( true ) {
      CVar14 = ChannelList::end(this_00);
      if ((const_iterator)cVar13._M_node == CVar14._i._M_node) {
        return;
      }
      if (2 < (ulong)cVar13._M_node[9]._M_color) break;
      piVar6 = &this->_data->combinedSampleSize;
      *piVar6 = *piVar6 + *(int *)(&DAT_0033ebbc + (ulong)cVar13._M_node[9]._M_color * 4);
      cVar13._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar13._M_node);
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar15 = std::operator<<((ostream *)local_1a0,"Bad type for channel ");
    poVar15 = std::operator<<(poVar15,(char *)(cVar13._M_node + 1));
    std::operator<<(poVar15," initializing deepscanline reader");
    pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar16,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar16,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar15 = std::operator<<((ostream *)local_1a0,"Version ");
  piVar6 = Header::version(&this->_data->header);
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,*piVar6);
  std::operator<<(poVar15," not supported for deeptiled images in this version of the library");
  pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar16,(stringstream *)&_iex_throw_s);
  __cxa_throw(pAVar16,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
DeepTiledInputFile::initialize ()
{
    if (_data->partNumber == -1)
        if (_data->header.type() != DEEPTILE)
            throw IEX_NAMESPACE::ArgExc ("Expected a deep tiled file but the file is not deep tiled.");
   if(_data->header.version()!=1)
   {
       THROW(IEX_NAMESPACE::ArgExc, "Version " << _data->header.version() << " not supported for deeptiled images in this version of the library");
   }
        
    _data->header.sanityCheck (true);

    _data->tileDesc = _data->header.tileDescription();
    _data->lineOrder = _data->header.lineOrder();

    //
    // Save the dataWindow information
    //

    const Box2i &dataWindow = _data->header.dataWindow();
    _data->minX = dataWindow.min.x;
    _data->maxX = dataWindow.max.x;
    _data->minY = dataWindow.min.y;
    _data->maxY = dataWindow.max.y;

    //
    // Precompute level and tile information to speed up utility functions
    //

    precalculateTileInfo (_data->tileDesc,
                          _data->minX, _data->maxX,
                          _data->minY, _data->maxY,
                          _data->numXTiles, _data->numYTiles,
                          _data->numXLevels, _data->numYLevels);

    //
    // Create all the TileBuffers and allocate their internal buffers
    //

    _data->tileOffsets = TileOffsets (_data->tileDesc.mode,
                                      _data->numXLevels,
                                      _data->numYLevels,
                                      _data->numXTiles,
                                      _data->numYTiles);

    for (size_t i = 0; i < _data->tileBuffers.size(); i++)
        _data->tileBuffers[i] = new TileBuffer ();

    _data->maxSampleCountTableSize = _data->tileDesc.ySize *
                                     _data->tileDesc.xSize *
                                     sizeof(int);

    _data->sampleCountTableBuffer.resizeErase(_data->maxSampleCountTableSize);

    _data->sampleCountTableComp = newCompressor(_data->header.compression(),
                                                _data->maxSampleCountTableSize,
                                                _data->header);
                                                
                                                
    const ChannelList & c=_data->header.channels();
    _data->combinedSampleSize=0;
    for(ChannelList::ConstIterator i=c.begin();i!=c.end();i++)
    {
        switch( i.channel().type )
        {
            case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF  :
                _data->combinedSampleSize+=Xdr::size<half>();
                break;
            case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT :
                _data->combinedSampleSize+=Xdr::size<float>();
                break;
            case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT  :
                _data->combinedSampleSize+=Xdr::size<unsigned int>();
                break;
            default :
                THROW(IEX_NAMESPACE::ArgExc, "Bad type for channel " << i.name() << " initializing deepscanline reader");
        }
    }
                                                  
}